

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterFree(Fts5Iter *pIter)

{
  int local_14;
  int i;
  Fts5Iter *pIter_local;
  
  if (pIter != (Fts5Iter *)0x0) {
    for (local_14 = 0; local_14 < pIter->nSeg; local_14 = local_14 + 1) {
      fts5SegIterClear(pIter->aSeg + local_14);
    }
    sqlite3Fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
  }
  return;
}

Assistant:

static void fts5MultiIterFree(Fts5Iter *pIter){
  if( pIter ){
    int i;
    for(i=0; i<pIter->nSeg; i++){
      fts5SegIterClear(&pIter->aSeg[i]);
    }
    fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
  }
}